

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O0

bool __thiscall
llvm::cl::opt<(anonymous_namespace)::HelpPrinterWrapper,_true,_llvm::cl::parser<bool>_>::
handleOccurrence(opt<(anonymous_namespace)::HelpPrinterWrapper,_true,_llvm::cl::parser<bool>_> *this
                ,uint pos,StringRef ArgName,StringRef Arg)

{
  bool bVar1;
  bool local_3d;
  uint local_3c;
  parser_data_type Val;
  opt<(anonymous_namespace)::HelpPrinterWrapper,_true,_llvm::cl::parser<bool>_> *poStack_38;
  uint pos_local;
  opt<(anonymous_namespace)::HelpPrinterWrapper,_true,_llvm::cl::parser<bool>_> *this_local;
  StringRef Arg_local;
  StringRef ArgName_local;
  
  Arg_local.Data = (char *)Arg.Length;
  this_local = (opt<(anonymous_namespace)::HelpPrinterWrapper,_true,_llvm::cl::parser<bool>_> *)
               Arg.Data;
  Arg_local.Length = (size_t)ArgName.Data;
  local_3d = false;
  local_3c = pos;
  poStack_38 = this;
  bVar1 = parser<bool>::parse(&this->Parser,&this->super_Option,ArgName,Arg,&local_3d);
  if (!bVar1) {
    opt_storage<(anonymous_namespace)::HelpPrinterWrapper,_true,_true>::setValue<bool>
              (&this->super_opt_storage<(anonymous_namespace)::HelpPrinterWrapper,_true,_true>,
               &local_3d,false);
    Option::setPosition(&this->super_Option,local_3c);
  }
  return bVar1;
}

Assistant:

bool handleOccurrence(unsigned pos, StringRef ArgName,
                        StringRef Arg) override {
    typename ParserClass::parser_data_type Val =
        typename ParserClass::parser_data_type();
    if (Parser.parse(*this, ArgName, Arg, Val))
      return true; // Parse error!
    this->setValue(Val);
    this->setPosition(pos);
    return false;
  }